

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void ss_swapmerge(uchar *T,int *PA,int *first,int *middle,int *last,int *buf,int bufsize,int depth)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uint *puVar6;
  uint *puVar7;
  uint uVar8;
  uint *puVar9;
  int *p2;
  ulong uVar10;
  uint *puVar11;
  int iVar12;
  uint *puVar13;
  uint *puVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  uint *local_488;
  uint local_47c;
  int *local_468;
  anon_struct_32_4_d8a569f3 stack [32];
  
  uVar5 = 0;
  local_47c = 0;
LAB_001e5c5e:
  while( true ) {
    uVar15 = (long)last - (long)middle;
    uVar17 = (long)uVar15 >> 2;
    iVar12 = (int)uVar5;
    if ((long)uVar17 <= (long)bufsize) {
      if ((middle < last) && (first < middle)) {
        puVar9 = (uint *)((long)buf + (uVar15 - 4));
        ss_blockswap(buf,middle,(int)(uVar15 >> 2));
        uVar16 = *(uint *)((long)buf + (uVar15 - 4));
        uVar8 = (int)uVar16 >> 0x1f;
        local_468 = PA + (uVar8 ^ uVar16);
        puVar7 = (uint *)middle + -1;
        uVar16 = (int)((uint *)middle)[-1] >> 0x1f;
        uVar8 = uVar16 * -2 - uVar8;
        p2 = PA + (uVar16 ^ ((uint *)middle)[-1]);
        puVar6 = (uint *)last + -1;
        uVar16 = ((uint *)last)[-1];
        while( true ) {
          while( true ) {
            while( true ) {
              iVar4 = ss_compare(T,local_468,p2,2);
              puVar11 = (uint *)buf;
              if (iVar4 < 1) break;
              uVar3 = *puVar9;
              puVar13 = puVar9;
              if ((uVar8 & 1) != 0) {
                do {
                  *puVar6 = uVar3;
                  puVar13 = puVar6 + -1;
                  puVar6 = puVar6 + -1;
                  *puVar9 = *puVar13;
                  uVar3 = puVar9[-1];
                  puVar9 = puVar9 + -1;
                } while ((int)uVar3 < 0);
                uVar8 = uVar8 & 0xfffffffe;
                puVar13 = puVar9;
              }
              *puVar6 = uVar3;
              if (puVar13 <= buf) goto LAB_001e63c2;
              puVar6 = puVar6 + -1;
              puVar9 = puVar13 + -1;
              *puVar13 = *puVar6;
              uVar5 = (ulong)(int)puVar13[-1];
              if ((long)uVar5 < 0) {
                uVar5 = (ulong)~puVar13[-1];
                uVar8 = uVar8 | 1;
              }
              local_468 = PA + uVar5;
            }
            if (-1 < iVar4) break;
            uVar3 = *puVar7;
            if ((uVar8 & 2) != 0) {
              do {
                *puVar6 = uVar3;
                puVar11 = puVar6 + -1;
                puVar6 = puVar6 + -1;
                *puVar7 = *puVar11;
                uVar3 = puVar7[-1];
                puVar7 = puVar7 + -1;
              } while ((int)uVar3 < 0);
              uVar8 = uVar8 & 0xfffffffd;
            }
            *puVar6 = uVar3;
            puVar11 = puVar6 + -1;
            puVar6 = puVar6 + -1;
            *puVar7 = *puVar11;
            puVar7 = puVar7 + -1;
            if (puVar7 < first) goto LAB_001e638b;
            uVar3 = *puVar7;
            uVar1 = ~uVar3;
            if (-1 < (int)uVar3) {
              uVar1 = uVar3;
            }
            if (-1 >= (int)uVar3) {
              uVar8 = uVar8 | 2;
            }
            p2 = PA + uVar1;
          }
          uVar3 = *puVar9;
          if ((uVar8 & 1) != 0) {
            do {
              *puVar6 = uVar3;
              puVar13 = puVar6 + -1;
              puVar6 = puVar6 + -1;
              *puVar9 = *puVar13;
              uVar3 = puVar9[-1];
              puVar9 = puVar9 + -1;
            } while ((int)uVar3 < 0);
            uVar8 = uVar8 & 0xfffffffe;
          }
          *puVar6 = ~uVar3;
          if (puVar9 <= buf) goto LAB_001e63c2;
          puVar11 = puVar6 + -1;
          *puVar9 = puVar6[-1];
          uVar3 = *puVar7;
          if ((uVar8 & 2) != 0) {
            do {
              *puVar11 = uVar3;
              puVar6 = puVar11 + -1;
              puVar11 = puVar11 + -1;
              *puVar7 = *puVar6;
              uVar3 = puVar7[-1];
              puVar7 = puVar7 + -1;
            } while ((int)uVar3 < 0);
            uVar8 = 0;
          }
          puVar9 = puVar9 + -1;
          *puVar11 = uVar3;
          puVar6 = puVar11 + -1;
          *puVar7 = puVar11[-1];
          puVar7 = puVar7 + -1;
          if (puVar7 < first) break;
          uVar3 = *puVar9;
          uVar8 = uVar3 >> 0x1f | uVar8;
          local_468 = PA + ((int)uVar3 >> 0x1f ^ uVar3);
          uVar3 = *puVar7;
          if ((long)(int)uVar3 < 0) {
            p2 = PA + ~uVar3;
            uVar8 = uVar8 | 2;
          }
          else {
            p2 = PA + (int)uVar3;
          }
        }
        for (; buf < puVar9; puVar9 = puVar9 + -1) {
          *puVar6 = *puVar9;
          puVar7 = puVar6 + -1;
          puVar6 = puVar6 + -1;
          *puVar9 = *puVar7;
        }
        goto LAB_001e63bd;
      }
      goto LAB_001e63d3;
    }
    uVar10 = (long)middle - (long)first;
    uVar5 = (long)uVar10 >> 2;
    if ((long)uVar5 <= (long)bufsize) break;
    if ((long)uVar5 < (long)uVar17) {
      uVar17 = uVar5;
    }
    puVar9 = (uint *)middle + -1;
    uVar5 = 0;
LAB_001e5cab:
    iVar4 = (int)uVar5;
    while (uVar8 = (uint)uVar17, 0 < (int)uVar8) {
      uVar16 = uVar8 >> 1;
      uVar17 = (ulong)uVar16;
      iVar2 = ss_compare(T,PA + ((int)((uint *)middle)[(long)iVar4 + uVar17] >> 0x1f ^
                                ((uint *)middle)[(long)iVar4 + uVar17]),
                         PA + ((int)puVar9[-(long)iVar4 - uVar17] >> 0x1f ^
                              puVar9[-(long)iVar4 - uVar17]),2);
      if (iVar2 < 0) goto code_r0x001e5d09;
    }
    if (iVar4 < 1) {
      uVar8 = *middle;
      iVar4 = ss_compare(T,PA + ((int)((uint *)middle)[-1] >> 0x1f ^ ((uint *)middle)[-1]),
                         PA + (int)uVar8,2);
      if (iVar4 == 0) {
        *middle = ~uVar8;
      }
      if ((local_47c & 1) == 0) {
        if ((local_47c & 2) != 0) {
          uVar8 = *first;
          iVar4 = ss_compare(T,PA + ((int)((uint *)first)[-1] >> 0x1f ^ ((uint *)first)[-1]),
                             PA + (int)uVar8,2);
          if (iVar4 == 0) goto LAB_001e6338;
        }
      }
      else {
        uVar8 = *first;
LAB_001e6338:
        *first = ~uVar8;
      }
      if ((local_47c & 4) != 0) {
        uVar8 = *last;
        iVar4 = ss_compare(T,PA + ((int)((uint *)last)[-1] >> 0x1f ^ ((uint *)last)[-1]),
                           PA + (int)uVar8,2);
        if (iVar4 == 0) {
          *last = ~uVar8;
        }
      }
      if (iVar12 < 0) {
        __assert_fail("0 <= ssize",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xb7f2,
                      "void ss_swapmerge(const unsigned char *, const int *, int *, int *, int *, int *, int, int)"
                     );
      }
      goto LAB_001e6553;
    }
    puVar13 = (uint *)middle + -uVar5;
    puVar7 = (uint *)middle + uVar5;
    ss_blockswap((int *)puVar13,middle,iVar4);
    uVar8 = 0;
    puVar6 = (uint *)middle;
    puVar11 = (uint *)middle;
    if (puVar7 < last) {
      if ((int)*puVar7 < 0) {
        *puVar7 = ~*puVar7;
        if (first < puVar13) {
          do {
            uVar10 = uVar10 - 4;
            puVar9 = puVar6 + -1;
            puVar6 = puVar6 + -1;
          } while ((int)*puVar9 < 0);
          uVar8 = 5;
        }
        else {
          uVar8 = 1;
        }
      }
      else if (first < puVar13) {
        uVar15 = (long)last + (4 - (long)middle);
        do {
          uVar15 = uVar15 - 4;
          puVar11 = puVar9 + 1;
          puVar9 = puVar9 + 1;
        } while ((int)*puVar11 < 0);
        uVar8 = 2;
        puVar11 = puVar9;
      }
    }
    if ((long)uVar15 < (long)uVar10) {
      if (0x1f < iVar12) {
        __assert_fail("ssize < STACK_SIZE",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xb7ea,
                      "void ss_swapmerge(const unsigned char *, const int *, int *, int *, int *, int *, int, int)"
                     );
      }
      uVar16 = uVar8 ^ 6;
      if ((uVar8 & 2) == 0) {
        uVar16 = uVar8;
      }
      if (puVar11 != (uint *)middle) {
        uVar16 = uVar8;
      }
      stack[iVar12].a = first;
      stack[iVar12].b = (int *)puVar13;
      stack[iVar12].c = (int *)puVar6;
      uVar5 = (ulong)(iVar12 + 1);
      stack[iVar12].d = uVar16 & 0xfffffffc | local_47c & 3;
      local_47c = local_47c & 4 | uVar16 & 3;
      first = (int *)puVar11;
      middle = (int *)puVar7;
    }
    else {
      if (0x1f < iVar12) {
        __assert_fail("ssize < STACK_SIZE",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xb7e6,
                      "void ss_swapmerge(const unsigned char *, const int *, int *, int *, int *, int *, int, int)"
                     );
      }
      stack[iVar12].a = (int *)puVar11;
      stack[iVar12].b = (int *)puVar7;
      stack[iVar12].c = last;
      uVar5 = (ulong)(iVar12 + 1);
      stack[iVar12].d = local_47c & 4 | uVar8 & 3;
      local_47c = local_47c & 3 | uVar8 & 0xfffffffc;
      middle = (int *)puVar13;
      last = (int *)puVar6;
    }
  }
  if (first < middle) {
    puVar6 = (uint *)((long)buf + (uVar10 - 4));
    ss_blockswap(buf,first,(int)(uVar10 >> 2));
    uVar8 = *first;
    puVar9 = (uint *)buf;
    puVar7 = (uint *)first;
    local_488 = (uint *)middle;
    do {
      while( true ) {
        while( true ) {
          uVar5 = (ulong)(int)*puVar9;
          uVar16 = *local_488;
          uVar17 = (ulong)(int)uVar16;
          iVar4 = ss_compare(T,PA + uVar5,PA + uVar17,2);
          puVar11 = puVar9;
          if (-1 < iVar4) break;
          do {
            *puVar7 = (uint)uVar5;
            if (puVar6 <= puVar11) goto LAB_001e64a4;
            puVar13 = puVar7 + 1;
            puVar7 = puVar7 + 1;
            puVar9 = puVar11 + 1;
            *puVar11 = *puVar13;
            puVar13 = puVar11 + 1;
            uVar5 = (ulong)*puVar13;
            puVar11 = puVar9;
          } while ((int)*puVar13 < 0);
        }
        puVar11 = puVar7;
        if (iVar4 == 0) break;
        do {
          puVar7 = puVar11 + 1;
          puVar13 = local_488 + 1;
          *puVar11 = (uint)uVar17;
          *local_488 = *puVar7;
          if (last <= puVar13) goto LAB_001e6478;
          uVar17 = (ulong)*puVar13;
          local_488 = puVar13;
          puVar11 = puVar7;
        } while ((int)*puVar13 < 0);
      }
      *local_488 = ~uVar16;
      uVar16 = *puVar9;
      puVar11 = puVar9;
      puVar13 = puVar7 + 2;
      do {
        puVar14 = puVar13;
        *puVar7 = uVar16;
        if (puVar6 <= puVar11) goto LAB_001e64a4;
        puVar13 = puVar7 + 1;
        puVar7 = puVar7 + 1;
        puVar9 = puVar11 + 1;
        *puVar11 = *puVar13;
        uVar16 = puVar11[1];
        puVar11 = puVar9;
        puVar13 = puVar14 + 1;
      } while ((int)uVar16 < 0);
      uVar16 = *local_488;
      puVar11 = local_488;
      do {
        puVar7 = puVar14;
        local_488 = puVar11 + 1;
        puVar7[-1] = uVar16;
        *puVar11 = *puVar7;
        if (last <= local_488) goto LAB_001e622d;
        uVar16 = *local_488;
        puVar14 = puVar7 + 1;
        puVar11 = local_488;
      } while ((int)uVar16 < 0);
    } while( true );
  }
  goto LAB_001e64b6;
LAB_001e638b:
  for (; buf < puVar9; puVar9 = puVar9 + -1) {
    *puVar6 = *puVar9;
    puVar7 = puVar6 + -1;
    puVar6 = puVar6 + -1;
    *puVar9 = *puVar7;
  }
LAB_001e63bd:
  *puVar6 = *puVar9;
  puVar11 = puVar9;
LAB_001e63c2:
  *puVar11 = uVar16;
LAB_001e63d3:
  if ((local_47c & 1) == 0) {
    if ((local_47c & 2) != 0) {
      uVar8 = *first;
      iVar4 = ss_compare(T,PA + ((int)((uint *)first)[-1] >> 0x1f ^ ((uint *)first)[-1]),
                         PA + (int)uVar8,2);
      if (iVar4 == 0) goto LAB_001e6427;
    }
  }
  else {
    uVar8 = *first;
LAB_001e6427:
    *first = ~uVar8;
  }
  if ((local_47c & 4) != 0) {
    uVar8 = *last;
    iVar4 = ss_compare(T,PA + ((int)((uint *)last)[-1] >> 0x1f ^ ((uint *)last)[-1]),PA + (int)uVar8
                       ,2);
    if (iVar4 == 0) {
      *last = ~uVar8;
    }
  }
  if (iVar12 < 0) {
    __assert_fail("0 <= ssize",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xb7bf,
                  "void ss_swapmerge(const unsigned char *, const int *, int *, int *, int *, int *, int, int)"
                 );
  }
  goto LAB_001e6553;
LAB_001e6478:
  for (; puVar9 < puVar6; puVar9 = puVar9 + 1) {
    *puVar7 = *puVar9;
    puVar11 = puVar7 + 1;
    puVar7 = puVar7 + 1;
    *puVar9 = *puVar11;
  }
  goto LAB_001e6238;
LAB_001e622d:
  for (; puVar9 < puVar6; puVar9 = puVar9 + 1) {
    *puVar7 = *puVar9;
    puVar11 = puVar7 + 1;
    puVar7 = puVar7 + 1;
    *puVar9 = *puVar11;
  }
LAB_001e6238:
  *puVar7 = *puVar9;
  puVar6 = puVar9;
LAB_001e64a4:
  *puVar6 = uVar8;
LAB_001e64b6:
  if ((local_47c & 1) == 0) {
    if ((local_47c & 2) != 0) {
      uVar8 = *first;
      iVar4 = ss_compare(T,PA + ((int)((uint *)first)[-1] >> 0x1f ^ ((uint *)first)[-1]),
                         PA + (int)uVar8,2);
      if (iVar4 == 0) goto LAB_001e650b;
    }
  }
  else {
    uVar8 = *first;
LAB_001e650b:
    *first = ~uVar8;
  }
  if ((local_47c & 4) != 0) {
    uVar8 = *last;
    iVar4 = ss_compare(T,PA + ((int)((uint *)last)[-1] >> 0x1f ^ ((uint *)last)[-1]),PA + (int)uVar8
                       ,2);
    if (iVar4 == 0) {
      *last = ~uVar8;
    }
  }
  if (iVar12 < 0) {
    __assert_fail("0 <= ssize",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xb7c8,
                  "void ss_swapmerge(const unsigned char *, const int *, int *, int *, int *, int *, int, int)"
                 );
  }
LAB_001e6553:
  if (iVar12 == 0) {
    return;
  }
  uVar5 = (ulong)(iVar12 - 1);
  first = stack[uVar5].a;
  middle = stack[uVar5].b;
  last = stack[uVar5].c;
  local_47c = stack[uVar5].d;
  goto LAB_001e5c5e;
code_r0x001e5d09:
  uVar5 = (ulong)(iVar4 + uVar16 + 1);
  uVar17 = (ulong)(uVar16 - (~uVar8 & 1));
  goto LAB_001e5cab;
}

Assistant:

static
void
ss_swapmerge(const unsigned char *T, const int *PA,
             int *first, int *middle, int *last,
             int *buf, int bufsize, int depth) {
#define STACK_SIZE SS_SMERGE_STACKSIZE
#define GETIDX(a) ((0 <= (a)) ? (a) : (~(a)))
#define MERGE_CHECK(a, b, c)\
  do {\
    if(((c) & 1) ||\
       (((c) & 2) && (ss_compare(T, PA + GETIDX(*((a) - 1)), PA + *(a), depth) == 0))) {\
      *(a) = ~*(a);\
    }\
    if(((c) & 4) && ((ss_compare(T, PA + GETIDX(*((b) - 1)), PA + *(b), depth) == 0))) {\
      *(b) = ~*(b);\
    }\
  } while(0)
  struct { int *a, *b, *c; int d; } stack[STACK_SIZE];
  int *l, *r, *lm, *rm;
  int m, len, half;
  int ssize;
  int check, next;

  for(check = 0, ssize = 0;;) {
    if((last - middle) <= bufsize) {
      if((first < middle) && (middle < last)) {
        ss_mergebackward(T, PA, first, middle, last, buf, depth);
      }
      MERGE_CHECK(first, last, check);
      STACK_POP(first, middle, last, check);
      continue;
    }

    if((middle - first) <= bufsize) {
      if(first < middle) {
        ss_mergeforward(T, PA, first, middle, last, buf, depth);
      }
      MERGE_CHECK(first, last, check);
      STACK_POP(first, middle, last, check);
      continue;
    }

    for(m = 0, len = MIN(middle - first, last - middle), half = len >> 1;
        0 < len;
        len = half, half >>= 1) {
      if(ss_compare(T, PA + GETIDX(*(middle + m + half)),
                       PA + GETIDX(*(middle - m - half - 1)), depth) < 0) {
        m += half + 1;
        half -= (len & 1) ^ 1;
      }
    }

    if(0 < m) {
      lm = middle - m, rm = middle + m;
      ss_blockswap(lm, middle, m);
      l = r = middle, next = 0;
      if(rm < last) {
        if(*rm < 0) {
          *rm = ~*rm;
          if(first < lm) { for(; *--l < 0;) { } next |= 4; }
          next |= 1;
        } else if(first < lm) {
          for(; *r < 0; ++r) { }
          next |= 2;
        }
      }

      if((l - first) <= (last - r)) {
        STACK_PUSH(r, rm, last, (next & 3) | (check & 4));
        middle = lm, last = l, check = (check & 3) | (next & 4);
      } else {
        if((next & 2) && (r == middle)) { next ^= 6; }
        STACK_PUSH(first, lm, l, (check & 3) | (next & 4));
        first = r, middle = rm, check = (next & 3) | (check & 4);
      }
    } else {
      if(ss_compare(T, PA + GETIDX(*(middle - 1)), PA + *middle, depth) == 0) {
        *middle = ~*middle;
      }
      MERGE_CHECK(first, last, check);
      STACK_POP(first, middle, last, check);
    }
  }
#undef STACK_SIZE
}